

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# includeLoopRecognition.cpp
# Opt level: O1

string * realFilename(string *__return_storage_ptr__,string *file)

{
  char __lhs;
  uint uVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  uVar1 = (uint)file->_M_string_length;
  uVar2 = (ulong)uVar1;
  if (-1 < (int)(uVar1 - 1)) {
    do {
      uVar1 = (int)uVar2 - 1;
      uVar2 = (ulong)uVar1;
      __lhs = (file->_M_dataplus)._M_p[uVar2];
      if (__lhs == '/') {
        return __return_storage_ptr__;
      }
      std::operator+(&local_50,__lhs,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while (0 < (int)uVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string realFilename(std::string file) {
    std::string filename;
    for (int i = file.size() - 1; i >= 0; --i) {
        char c = file[i];
        if (c == '/') {
            break;
        }
        filename = c + filename;
    }
    return filename;
}